

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t * Gia_ManEquivToChoices(Gia_Man_t *p,int nSnapshots)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Rpr_t *pGVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar7;
  bool bVar8;
  int local_44;
  int i;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vNodes;
  int nSnapshots_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCoNum(p);
  if (iVar1 % nSnapshots != 0) {
    __assert_fail("(Gia_ManCoNum(p) % nSnapshots) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x7bc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
  }
  Gia_ManSetPhase(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  iVar1 = Gia_ManObjNum(p);
  pGVar4 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p_00->pReprs = pGVar4;
  iVar1 = Gia_ManObjNum(p);
  piVar5 = (int *)calloc((long)iVar1,4);
  p_00->pNexts = piVar5;
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= local_44) break;
    Gia_ObjSetRepr(p_00,local_44,0xfffffff);
    local_44 = local_44 + 1;
  }
  Gia_ManFillValue(p);
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar8 = false;
    if (local_44 < iVar1) {
      pRepr = Gia_ManCi(p,local_44);
      bVar8 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pRepr->Value = uVar2;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar8 = false;
    if (local_44 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pRepr = Gia_ManCi(p,iVar1 + local_44);
      bVar8 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjId(p,pRepr);
    pGVar6 = Gia_ObjReprObj(p,iVar1);
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      iVar1 = Gia_ObjIsConst0(pGVar6);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsRo(p,pGVar6);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x7cc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
        }
      }
      pRepr->Value = pGVar6->Value;
    }
    local_44 = local_44 + 1;
  }
  Gia_ManHashAlloc(p_00);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (local_44 < iVar1) {
      pRepr = Gia_ManCo(p,local_44);
      bVar8 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pGVar6 = Gia_ObjFanin0(pRepr);
    Gia_ManEquivToChoices_rec(p_00,p,pGVar6);
    local_44 = local_44 + 1;
  }
  p_01 = Gia_ManGetDangling(p);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_01);
    bVar8 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(p_01,local_44);
      pRepr = Gia_ManObj(p,iVar1);
      bVar8 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    Gia_ManEquivToChoices_rec(p_00,p,pRepr);
    local_44 = local_44 + 1;
  }
  Vec_IntFree(p_01);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (local_44 < iVar1) {
      pRepr = Gia_ManCo(p,local_44);
      bVar8 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    if (local_44 % nSnapshots == 0) {
      iVar1 = Gia_ObjFanin0Copy(pRepr);
      Gia_ManAppendCo(p_00,iVar1);
    }
    local_44 = local_44 + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  Gia_ManRemoveBadChoices(p_00);
  pGVar7 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManEquivToChoices( Gia_Man_t * p, int nSnapshots )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    int i;
//Gia_ManEquivPrintClasses( p, 0, 0 );
    assert( (Gia_ManCoNum(p) % nSnapshots) == 0 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    pNew->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            assert( Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr) );
            pObj->Value = pRepr->Value;
        }
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    vNodes = Gia_ManGetDangling( p );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, pObj );
    Vec_IntFree( vNodes );
    Gia_ManForEachCo( p, pObj, i )
        if ( i % nSnapshots == 0 )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManRemoveBadChoices( pNew );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    return pNew;
}